

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

span<const_char> __thiscall mpt::message_store::entry::data(entry *this,int part)

{
  content *d;
  void *pvVar1;
  size_t sVar2;
  char cVar3;
  ulong uVar4;
  content *pcVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __n;
  content *pcVar8;
  span<const_char> sVar9;
  
  pcVar8 = (this->super_array)._buf._ref;
  if (pcVar8 == (content *)0x0) {
    pcVar5 = (content *)0x0;
  }
  else {
    pcVar5 = (content *)0x0;
    if (*(long *)(pcVar8 + 8) == 0) {
      pcVar5 = pcVar8 + 0x20;
    }
  }
  if ((pcVar8 == (content *)0x0) || (*(long *)(pcVar8 + 8) != 0)) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ulong *)(pcVar8 + 0x18);
  }
  sVar2 = 0;
  pcVar8 = (content *)0x0;
  if (3 < uVar6) {
    uVar4 = (ulong)(byte)*pcVar5 + 4;
    sVar2 = 0;
    sVar7 = uVar6 - uVar4;
    pcVar8 = (content *)0x0;
    if (uVar4 <= uVar6 && sVar7 != 0) {
      pcVar5 = pcVar5 + uVar4;
      __n = sVar7;
      pcVar8 = pcVar5;
      do {
        sVar2 = sVar7;
        if (part < 0) goto LAB_0012e4db;
        pvVar1 = memchr(pcVar8,0,__n);
        cVar3 = (part == 0) * '\x02' + '\x01';
        if (pvVar1 != (void *)0x0) {
          sVar2 = (long)pvVar1 - (long)pcVar8;
          if (part == 0) {
            __n = sVar2;
            cVar3 = '\x03';
          }
          else {
            pcVar8 = pcVar8 + sVar2 + 1;
            __n = __n - (sVar2 + 1);
            cVar3 = '\0';
          }
        }
      } while (cVar3 == '\0');
      sVar2 = __n;
      pcVar5 = pcVar8;
      if (cVar3 == '\x03') {
LAB_0012e4db:
        pcVar8 = (content *)0x0;
        if (-1 < (long)sVar2) {
          pcVar8 = pcVar5;
        }
      }
      else {
        sVar2 = 0;
        pcVar8 = (content *)0x0;
      }
    }
  }
  sVar9._len = sVar2;
  sVar9._base = (char *)pcVar8;
  return sVar9;
}

Assistant:

span<const char> message_store::entry::data(int part) const
{
	header *h = static_cast<header *>(base());
	const char *data;
	size_t skip, len = length();
	
	if ((len < sizeof(*h)) || ((len <= (skip = h->from + sizeof(*h))))) {
		return span<const char>(0, 0);
	}
	data = ((char *) h) + skip;
	len -= skip;
	
	while (part >= 0) {
		const char *end;
		
		if (!(end = (const char *) memchr(data, 0, len))) {
			if (part) {
				return span<const char>(0, 0);
			}
			break;
		}
		skip = end - data;
		if (!part) {
			len = skip;
			break;
		}
		++skip;
		
		data += skip;
		len  -= skip;
	}
	return span<const char>(data, len);
}